

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu.h
# Opt level: O0

kappa_pair_type floaxie::calculate_kappa_div(half_of_mantissa_storage_type n)

{
  unsigned_long uVar1;
  kappa_pair_type kStack_10;
  half_of_mantissa_storage_type n_local;
  
  uVar1 = static_pow<10u,1u>();
  if (n < uVar1) {
    kStack_10 = make_kappa_div<(unsigned_char)1>();
  }
  else {
    uVar1 = static_pow<10u,2u>();
    if (n < uVar1) {
      kStack_10 = make_kappa_div<(unsigned_char)2>();
    }
    else {
      uVar1 = static_pow<10u,3u>();
      if (n < uVar1) {
        kStack_10 = make_kappa_div<(unsigned_char)3>();
      }
      else {
        uVar1 = static_pow<10u,4u>();
        if (n < uVar1) {
          kStack_10 = make_kappa_div<(unsigned_char)4>();
        }
        else {
          uVar1 = static_pow<10u,5u>();
          if (n < uVar1) {
            kStack_10 = make_kappa_div<(unsigned_char)5>();
          }
          else {
            uVar1 = static_pow<10u,6u>();
            if (n < uVar1) {
              kStack_10 = make_kappa_div<(unsigned_char)6>();
            }
            else {
              uVar1 = static_pow<10u,7u>();
              if (n < uVar1) {
                kStack_10 = make_kappa_div<(unsigned_char)7>();
              }
              else {
                uVar1 = static_pow<10u,8u>();
                if (n < uVar1) {
                  kStack_10 = make_kappa_div<(unsigned_char)8>();
                }
                else {
                  uVar1 = static_pow<10u,9u>();
                  if (n < uVar1) {
                    kStack_10 = make_kappa_div<(unsigned_char)9>();
                  }
                  else {
                    kStack_10 = make_kappa_div<(unsigned_char)10>();
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return kStack_10;
}

Assistant:

constexpr kappa_pair_type calculate_kappa_div(half_of_mantissa_storage_type n) noexcept
	{
		if (n < static_pow<10, 1>()) return make_kappa_div<1>();
		if (n < static_pow<10, 2>()) return make_kappa_div<2>();
		if (n < static_pow<10, 3>()) return make_kappa_div<3>();
		if (n < static_pow<10, 4>()) return make_kappa_div<4>();
		if (n < static_pow<10, 5>()) return make_kappa_div<5>();
		if (n < static_pow<10, 6>()) return make_kappa_div<6>();
		if (n < static_pow<10, 7>()) return make_kappa_div<7>();
		if (n < static_pow<10, 8>()) return make_kappa_div<8>();
		if (n < static_pow<10, 9>()) return make_kappa_div<9>();
		return make_kappa_div<10>();
	}